

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O0

void allocateRandomTape(randomTape_t *tape,picnic_instance_t *params)

{
  void *pvVar1;
  size_t __size;
  long in_RSI;
  long in_RDI;
  uint8_t i;
  uint8_t *slab;
  size_t tapeSizeBytes;
  undefined1 local_21;
  undefined8 local_20;
  
  pvVar1 = calloc(1,(ulong)*(byte *)(in_RSI + 9));
  *(void **)(in_RDI + 0x80) = pvVar1;
  __size = (size_t)(int)((uint)*(byte *)(in_RSI + 9) << 1);
  pvVar1 = calloc(1,__size);
  *(void **)(in_RDI + 0x88) = pvVar1;
  local_20 = calloc((ulong)*(byte *)(in_RSI + 0xb),__size);
  for (local_21 = 0; local_21 < *(byte *)(in_RSI + 0xb); local_21 = local_21 + 1) {
    *(void **)(in_RDI + (ulong)local_21 * 8) = local_20;
    local_20 = (void *)(__size + (long)local_20);
  }
  *(undefined4 *)(in_RDI + 0x90) = 0;
  *(undefined4 *)(in_RDI + 0x94) = 0;
  return;
}

Assistant:

void allocateRandomTape(randomTape_t* tape, const picnic_instance_t* params) {
  tape->aux_bits       = calloc(1, params->view_size);
  size_t tapeSizeBytes = 2 * params->view_size;
  tape->parity_tapes   = calloc(1, tapeSizeBytes);
  uint8_t* slab        = calloc(params->num_MPC_parties, tapeSizeBytes);
  for (uint8_t i = 0; i < params->num_MPC_parties; i++) {
    tape->tape[i] = slab;
    slab += tapeSizeBytes;
  }
  tape->pos     = 0;
  tape->aux_pos = 0;
}